

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

void __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  string *psVar1;
  pointer pIVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  bool bVar5;
  __type _Var6;
  TargetType TVar7;
  ItemVector *pIVar8;
  cmLinkImplementation *pcVar9;
  string *psVar10;
  pointer this_00;
  pointer pcVar11;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_128;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_80;
  string libPath;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar8 = cmComputeLinkInformation::GetItems(cli);
  psVar1 = &cli->Config;
  std::__cxx11::string::string((string *)&config,(string *)psVar1);
  this_00 = (pIVar8->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (pIVar8->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = false;
  do {
    if (this_00 == pIVar2) {
      if (stdLibString->_M_string_length != 0) {
        libPath._M_dataplus._M_p._0_1_ = 0x20;
        cmStrCat<std::__cxx11::string_const&,char>(&linkLib.Value,stdLibString,(char *)&libPath);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   linkLibraries,&linkLib.Value);
        std::__cxx11::string::~string((string *)&linkLib);
      }
      std::__cxx11::string::~string((string *)&config);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emitted._M_t);
      return;
    }
    if (bVar5) {
LAB_003cca83:
      bVar5 = false;
    }
    else {
      if (this_00->Target != (cmGeneratorTarget *)0x0) {
        TVar7 = cmGeneratorTarget::GetType(this_00->Target);
        bVar5 = false;
        if (TVar7 - SHARED_LIBRARY < 3) goto LAB_003ccdcf;
        if (TVar7 == STATIC_LIBRARY) {
          pcVar3 = this_00->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&linkLib,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&libPath);
          bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&linkLib.Value);
          std::__cxx11::string::~string((string *)&linkLib);
          if (bVar5) goto LAB_003cca83;
        }
        else if (TVar7 == INTERFACE_LIBRARY) goto LAB_003ccdcf;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_128.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_128.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_128);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&linkLib,&local_f0,(cmListFileBacktrace *)&local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_128.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_f0);
      if (this_00->IsPath == Yes) {
        str._M_str = (this_00->Value).Value._M_dataplus._M_p;
        str._M_len = (this_00->Value).Value._M_string_length;
        bVar5 = cmHasLiteralSuffix<3ul>(str,(char (*) [3])0x6a16c7);
        if (((bVar5) ||
            (str_00._M_str = (this_00->Value).Value._M_dataplus._M_p,
            str_00._M_len = (this_00->Value).Value._M_string_length,
            bVar5 = cmHasLiteralSuffix<5ul>(str_00,(char (*) [5])".obj"), bVar5)) ||
           ((str_01._M_str = (this_00->Value).Value._M_dataplus._M_p,
            str_01._M_len = (this_00->Value).Value._M_string_length,
            bVar5 = cmHasLiteralSuffix<3ul>(str_01,(char (*) [3])0x67ebea), bVar5 ||
            (str_02._M_str = (this_00->Value).Value._M_dataplus._M_p,
            str_02._M_len = (this_00->Value).Value._M_string_length,
            bVar5 = cmHasLiteralSuffix<5ul>(str_02,(char (*) [5])".lib"), bVar5)))) {
          (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_80,this,this_00);
          cmLinkLineComputer::ConvertToOutputFormat
                    (&local_110,&this->super_cmLinkLineComputer,&local_80);
          cmComputeLinkInformation::Item::GetFormattedItem
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&libPath,this_00,&local_110);
          std::__cxx11::string::operator=((string *)&linkLib,(string *)&libPath);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&libPath);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_80);
        }
LAB_003cccc9:
        pVar12 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&emitted,&linkLib.Value);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::__cxx11::string::append((char *)&linkLib);
          pcVar3 = cli->Target;
          std::__cxx11::string::string((string *)&libPath,(string *)psVar1);
          pcVar9 = cmGeneratorTarget::GetLinkImplementation(pcVar3,&libPath,Link);
          std::__cxx11::string::~string((string *)&libPath);
          pcVar4 = (pcVar9->super_cmLinkImplementationLibraries).Libraries.
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pcVar11 = (pcVar9->super_cmLinkImplementationLibraries).Libraries.
                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl
                         .super__Vector_impl_data._M_start; pcVar11 != pcVar4; pcVar11 = pcVar11 + 1
              ) {
            pcVar3 = (pcVar11->super_cmLinkItem).Target;
            if ((pcVar3 != (cmGeneratorTarget *)0x0) &&
               (TVar7 = cmGeneratorTarget::GetType(pcVar3), TVar7 != INTERFACE_LIBRARY)) {
              pcVar3 = (pcVar11->super_cmLinkItem).Target;
              std::__cxx11::string::string((string *)&local_110,(string *)psVar1);
              psVar10 = cmGeneratorTarget::GetLocation(pcVar3,&local_110);
              std::__cxx11::string::string((string *)&libPath,(string *)psVar10);
              std::__cxx11::string::~string((string *)&local_110);
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this_00,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&libPath);
              if (_Var6) {
                std::
                __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)&linkLib.Backtrace,
                            (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             *)&(pcVar11->super_cmLinkItem).Backtrace);
                std::__cxx11::string::~string((string *)&libPath);
                break;
              }
              std::__cxx11::string::~string((string *)&libPath);
            }
          }
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<BT<std::__cxx11::string>&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     linkLibraries,&linkLib);
        }
        bVar5 = false;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&libPath,"-framework",(allocator<char> *)&local_110);
        _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&libPath);
        std::__cxx11::string::~string((string *)&libPath);
        bVar5 = true;
        if (!_Var6) {
          str_03._M_str = (this_00->Value).Value._M_dataplus._M_p;
          str_03._M_len = (this_00->Value).Value._M_string_length;
          bVar5 = cmHasLiteralPrefix<2ul>(str_03,(char (*) [2])0x6b2f33);
          if ((((!bVar5) ||
               (str_04._M_str = (this_00->Value).Value._M_dataplus._M_p,
               str_04._M_len = (this_00->Value).Value._M_string_length,
               bVar5 = cmHasLiteralPrefix<3ul>(str_04,(char (*) [3])0x69e983), bVar5)) ||
              (str_05._M_str = (this_00->Value).Value._M_dataplus._M_p,
              str_05._M_len = (this_00->Value).Value._M_string_length,
              bVar5 = cmHasLiteralPrefix<3ul>(str_05,(char (*) [3])"-L"), bVar5)) ||
             (str_06._M_str = (this_00->Value).Value._M_dataplus._M_p,
             str_06._M_len = (this_00->Value).Value._M_string_length,
             bVar5 = cmHasLiteralPrefix<10ul>(str_06,(char (*) [10])"--library"), bVar5)) {
            std::__cxx11::string::_M_assign((string *)&linkLib);
          }
          goto LAB_003cccc9;
        }
      }
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&linkLib);
    }
LAB_003ccdcf:
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;

  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      // nvcc understands absolute paths to libraries ending in '.o', .a', or
      // '.lib'. These should be passed to nvlink.  Other extensions need to be
      // left out because nvlink may not understand or need them.  Even though
      // it can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value.Value, ".o") ||
          cmHasLiteralSuffix(item.Value.Value, ".obj") ||
          cmHasLiteralSuffix(item.Value.Value, ".a") ||
          cmHasLiteralSuffix(item.Value.Value, ".lib")) {
        linkLib.Value = item
                          .GetFormattedItem(this->ConvertToOutputFormat(
                            this->ConvertToLinkReference(item.Value.Value)))
                          .Value;
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value.Value)) {
      linkLib.Value = item.Value.Value;
    }

    if (emitted.insert(linkLib.Value).second) {
      linkLib.Value += " ";

      const cmLinkImplementation* linkImpl =
        cli.GetTarget()->GetLinkImplementation(
          cli.GetConfig(), cmGeneratorTarget::LinkInterfaceFor::Link);

      for (const cmLinkImplItem& iter : linkImpl->Libraries) {
        if (iter.Target != nullptr &&
            iter.Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
          std::string libPath = iter.Target->GetLocation(cli.GetConfig());
          if (item.Value == libPath) {
            linkLib.Backtrace = iter.Backtrace;
            break;
          }
        }
      }

      linkLibraries.emplace_back(linkLib);
    }
  }

  if (!stdLibString.empty()) {
    linkLibraries.emplace_back(cmStrCat(stdLibString, ' '));
  }
}